

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonIterativeFeaturePreservingMeshFiltering.cpp
# Opt level: O0

void __thiscall
NonIterativeFeaturePreservingMeshFiltering::denoise
          (NonIterativeFeaturePreservingMeshFiltering *this)

{
  pointer *ppVVar1;
  allocator<OpenMesh::VectorT<double,_3>_> *this_00;
  VertexHandle _vh;
  ParameterSet *pPVar2;
  double dVar3;
  double sigma_f_00;
  Point pt_00;
  Point centroid_00;
  VertexIter VVar4;
  bool bVar5;
  int iVar6;
  size_t sVar7;
  Point *pPVar8;
  size_type sVar9;
  reference pvVar10;
  reference pvVar11;
  BaseHandle *pBVar12;
  reference pvVar13;
  VertexIter VVar14;
  VertexIter VVar15;
  VertexIter VVar16;
  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
  GVar17;
  VertexIter VVar18;
  VertexIter local_568;
  undefined1 local_558 [8];
  VertexIter v_it_2;
  vector_type local_538;
  vector_type local_520;
  vector_type local_508;
  value_type local_4f0;
  double area;
  double weight_influence;
  double local_4c8;
  double distance_influence;
  double weight_spatial;
  double local_4a0;
  double distance_spatial;
  double dStack_490;
  double local_488;
  double local_478;
  double dStack_470;
  double local_468;
  double local_458;
  double dStack_450;
  double local_448;
  undefined1 local_440 [8];
  Point projection_point;
  Normal normal;
  undefined1 auStack_408 [8];
  Point centroid;
  int local_3e4;
  double dStack_3e0;
  int i;
  double weight_sum;
  Point temp_point;
  undefined1 local_3b8 [8];
  vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> vertex_face_neighbor;
  undefined1 auStack_398 [8];
  Point pt;
  undefined1 local_370 [8];
  VertexIter v_it_1;
  VertexIter local_348;
  undefined1 local_338 [8];
  VertexIter v_it;
  undefined1 local_320 [8];
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> new_point;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
  mollified_normals;
  double sigma_g;
  double sigma_f;
  vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_> face_centroid
  ;
  vector<double,_std::allocator<double>_> face_area;
  double mean_edge_length;
  string local_2a0 [39];
  allocator local_279;
  string local_278 [32];
  double local_258;
  double sigma_f_mean_edge_length_ratio;
  double sigma_g_mean_edge_length_ratio;
  undefined1 local_238 [8];
  TriMesh mesh;
  NonIterativeFeaturePreservingMeshFiltering *this_local;
  
  mesh.super_Mesh.
  super_PolyMeshT<OpenMesh::AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>_>
  .super_AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>._544_8_
       = this;
  DataManager::getNoisyMesh((TriMesh *)local_238,(this->super_MeshDenoisingBase).data_manager_);
  sVar7 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)local_238);
  VVar4.hnd_.super_BaseHandle.idx_ = local_348.hnd_.super_BaseHandle.idx_;
  VVar4.skip_bits_ = local_348.skip_bits_;
  VVar4.mesh_ = local_348.mesh_;
  VVar15.hnd_.super_BaseHandle.idx_ = local_568.hnd_.super_BaseHandle.idx_;
  VVar15.skip_bits_ = local_568.skip_bits_;
  VVar15.mesh_ = local_568.mesh_;
  if (sVar7 == 0) {
    sigma_g_mean_edge_length_ratio._0_4_ = 1;
  }
  else {
    pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_278,"sigma_f/mean_edge_length",&local_279);
    bVar5 = ParameterSet::getValue(pPVar2,(string *)local_278,&local_258);
    std::__cxx11::string::~string(local_278);
    std::allocator<char>::~allocator((allocator<char> *)&local_279);
    VVar4.hnd_.super_BaseHandle.idx_ = local_348.hnd_.super_BaseHandle.idx_;
    VVar4.skip_bits_ = local_348.skip_bits_;
    VVar4.mesh_ = local_348.mesh_;
    VVar15.hnd_.super_BaseHandle.idx_ = local_568.hnd_.super_BaseHandle.idx_;
    VVar15.skip_bits_ = local_568.skip_bits_;
    VVar15.mesh_ = local_568.mesh_;
    if (((bVar5 ^ 0xffU) & 1) == 0) {
      pPVar2 = (this->super_MeshDenoisingBase).parameter_set_;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_2a0,"sigma_g/mean_edge_length",(allocator *)((long)&mean_edge_length + 7));
      bVar5 = ParameterSet::getValue(pPVar2,(string *)local_2a0,&sigma_f_mean_edge_length_ratio);
      std::__cxx11::string::~string(local_2a0);
      std::allocator<char>::~allocator((allocator<char> *)((long)&mean_edge_length + 7));
      VVar4.hnd_.super_BaseHandle.idx_ = local_348.hnd_.super_BaseHandle.idx_;
      VVar4.skip_bits_ = local_348.skip_bits_;
      VVar4.mesh_ = local_348.mesh_;
      VVar15.hnd_.super_BaseHandle.idx_ = local_568.hnd_.super_BaseHandle.idx_;
      VVar15.skip_bits_ = local_568.skip_bits_;
      VVar15.mesh_ = local_568.mesh_;
      if (((bVar5 ^ 0xffU) & 1) == 0) {
        dVar3 = MeshDenoisingBase::getAverageEdgeLength
                          (&this->super_MeshDenoisingBase,(TriMesh *)local_238);
        ppVVar1 = &face_centroid.
                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<double,_std::allocator<double>_>::vector
                  ((vector<double,_std::allocator<double>_> *)ppVVar1);
        MeshDenoisingBase::getFaceArea
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_238,
                   (vector<double,_std::allocator<double>_> *)ppVVar1);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)&sigma_f);
        MeshDenoisingBase::getFaceCentroid
                  (&this->super_MeshDenoisingBase,(TriMesh *)local_238,
                   (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    *)&sigma_f);
        sigma_f_00 = local_258 * dVar3;
        ppVVar1 = &new_point.
                   super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                   ._M_impl.super__Vector_impl_data._M_end_of_storage;
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)ppVVar1);
        mollifiedNormals(this,(TriMesh *)local_238,
                         (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)&sigma_f,
                         (vector<double,_std::allocator<double>_> *)
                         &face_centroid.
                          super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage,sigma_f_00,
                         (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)ppVVar1);
        sVar7 = OpenMesh::ArrayKernel::n_vertices((ArrayKernel *)local_238);
        this_00 = (allocator<OpenMesh::VectorT<double,_3>_> *)((long)&v_it.skip_bits_ + 3);
        std::allocator<OpenMesh::VectorT<double,_3>_>::allocator(this_00);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                *)local_320,sVar7,this_00);
        std::allocator<OpenMesh::VectorT<double,_3>_>::~allocator
                  ((allocator<OpenMesh::VectorT<double,_3>_> *)((long)&v_it.skip_bits_ + 3));
        VVar14 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_238);
        while( true ) {
          v_it.mesh_ = VVar14._8_8_;
          local_338 = (undefined1  [8])VVar14.mesh_;
          VVar15 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_238);
          local_348 = VVar15;
          bVar5 = OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_338,&local_348);
          if (!bVar5) break;
          pvVar11 = OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                 *)local_338);
          pPVar8 = OpenMesh::
                   AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            *)local_238,(VertexHandle)(pvVar11->super_BaseHandle).idx_);
          pBVar12 = &OpenMesh::Iterators::
                     GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                     ::operator->((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                   *)local_338)->super_BaseHandle;
          iVar6 = OpenMesh::BaseHandle::idx(pBVar12);
          pvVar13 = std::
                    vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)local_320,(long)iVar6);
          (pvVar13->super_VectorDataT<double,_3>).values_[0] =
               (pPVar8->super_VectorDataT<double,_3>).values_[0];
          (pvVar13->super_VectorDataT<double,_3>).values_[1] =
               (pPVar8->super_VectorDataT<double,_3>).values_[1];
          (pvVar13->super_VectorDataT<double,_3>).values_[2] =
               (pPVar8->super_VectorDataT<double,_3>).values_[2];
          GVar17 = OpenMesh::Iterators::
                   GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                   ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                 *)local_338,0);
          VVar14._8_8_ = v_it.mesh_;
          VVar14.mesh_ = (mesh_ptr)local_338;
          v_it_1._8_8_ = GVar17.mesh_;
        }
        VVar16 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_238);
        while( true ) {
          v_it_1.mesh_ = VVar16._8_8_;
          local_370 = (undefined1  [8])VVar16.mesh_;
          VVar15 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_238);
          pt.super_VectorDataT<double,_3>.values_[2] = (double)VVar15.mesh_;
          bVar5 = OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_370,
                               (GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)(pt.super_VectorDataT<double,_3>.values_ + 2));
          if (!bVar5) break;
          pvVar11 = OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                 *)local_370);
          vertex_face_neighbor.
          super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage._4_4_ = (pvVar11->super_BaseHandle).idx_;
          pPVar8 = OpenMesh::
                   AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                   ::point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                            *)local_238,
                           (VertexHandle)
                           vertex_face_neighbor.
                           super__Vector_base<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                           ._M_impl.super__Vector_impl_data._M_end_of_storage._4_4_);
          pt.super_VectorDataT<double,_3>.values_[1] =
               (pPVar8->super_VectorDataT<double,_3>).values_[2];
          auStack_398 = (undefined1  [8])(pPVar8->super_VectorDataT<double,_3>).values_[0];
          pt.super_VectorDataT<double,_3>.values_[0] =
               (pPVar8->super_VectorDataT<double,_3>).values_[1];
          std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::vector
                    ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     local_3b8);
          pvVar11 = OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                 *)local_370);
          temp_point.super_VectorDataT<double,_3>.values_[2]._4_4_ =
               (pvVar11->super_BaseHandle).idx_;
          getVertexFaceNeighbor
                    (this,(TriMesh *)local_238,
                     (vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      *)&sigma_f,
                     (VertexHandle)temp_point.super_VectorDataT<double,_3>.values_[2]._4_4_,
                     sigma_f_00,
                     (vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     local_3b8);
          OpenMesh::VectorT<double,_3>::VectorT((VectorT<double,_3> *)&weight_sum,0.0,0.0,0.0);
          dStack_3e0 = 0.0;
          local_3e4 = 0;
          while( true ) {
            sVar9 = std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::size
                              ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                *)local_3b8);
            if ((int)sVar9 <= local_3e4) break;
            pBVar12 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                       operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   *)local_3b8,(long)local_3e4)->super_BaseHandle;
            iVar6 = OpenMesh::BaseHandle::idx(pBVar12);
            pvVar13 = std::
                      vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    *)&sigma_f,(long)iVar6);
            centroid.super_VectorDataT<double,_3>.values_[1] =
                 (pvVar13->super_VectorDataT<double,_3>).values_[2];
            auStack_408 = (undefined1  [8])(pvVar13->super_VectorDataT<double,_3>).values_[0];
            centroid.super_VectorDataT<double,_3>.values_[0] =
                 (pvVar13->super_VectorDataT<double,_3>).values_[1];
            pBVar12 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                       operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   *)local_3b8,(long)local_3e4)->super_BaseHandle;
            iVar6 = OpenMesh::BaseHandle::idx(pBVar12);
            pvVar13 = std::
                      vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                      ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                    *)&new_point.
                                       super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                       ._M_impl.super__Vector_impl_data._M_end_of_storage,
                                   (long)iVar6);
            local_488 = (pvVar13->super_VectorDataT<double,_3>).values_[2];
            distance_spatial = (pvVar13->super_VectorDataT<double,_3>).values_[0];
            dStack_490 = (pvVar13->super_VectorDataT<double,_3>).values_[1];
            local_448 = pt.super_VectorDataT<double,_3>.values_[1];
            local_458 = (double)auStack_398;
            dStack_450 = pt.super_VectorDataT<double,_3>.values_[0];
            local_468 = centroid.super_VectorDataT<double,_3>.values_[1];
            local_478 = (double)auStack_408;
            dStack_470 = centroid.super_VectorDataT<double,_3>.values_[0];
            pt_00.super_VectorDataT<double,_3>.values_[1] =
                 pt.super_VectorDataT<double,_3>.values_[0];
            pt_00.super_VectorDataT<double,_3>.values_[0] = (double)auStack_398;
            pt_00.super_VectorDataT<double,_3>.values_[2] =
                 pt.super_VectorDataT<double,_3>.values_[1];
            centroid_00.super_VectorDataT<double,_3>.values_[1] =
                 centroid.super_VectorDataT<double,_3>.values_[0];
            centroid_00.super_VectorDataT<double,_3>.values_[0] = (double)auStack_408;
            centroid_00.super_VectorDataT<double,_3>.values_[2] =
                 centroid.super_VectorDataT<double,_3>.values_[1];
            projection_point.super_VectorDataT<double,_3>.values_[2] = distance_spatial;
            projectPoint((Point *)local_440,this,pt_00,centroid_00,
                         (VectorDataT<double,_3>)
                         *(VectorDataT<double,_3> *)(pvVar13->super_VectorDataT<double,_3>).values_)
            ;
            OpenMesh::VectorT<double,_3>::operator-
                      ((vector_type *)&weight_spatial,(VectorT<double,_3> *)auStack_408,
                       (vector_type *)auStack_398);
            local_4a0 = OpenMesh::VectorT<double,_3>::length((VectorT<double,_3> *)&weight_spatial);
            distance_influence = exp((local_4a0 * -0.5 * local_4a0) / (sigma_f_00 * sigma_f_00));
            OpenMesh::VectorT<double,_3>::operator-
                      ((vector_type *)&weight_influence,(VectorT<double,_3> *)local_440,
                       (vector_type *)auStack_398);
            local_4c8 = OpenMesh::VectorT<double,_3>::length
                                  ((VectorT<double,_3> *)&weight_influence);
            area = exp((local_4c8 * -0.5 * local_4c8) /
                       (sigma_f_mean_edge_length_ratio * dVar3 *
                       sigma_f_mean_edge_length_ratio * dVar3));
            pBVar12 = &std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::
                       operator[]((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>
                                   *)local_3b8,(long)local_3e4)->super_BaseHandle;
            iVar6 = OpenMesh::BaseHandle::idx(pBVar12);
            pvVar10 = std::vector<double,_std::allocator<double>_>::operator[]
                                ((vector<double,_std::allocator<double>_> *)
                                 &face_centroid.
                                  super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  ._M_impl.super__Vector_impl_data._M_end_of_storage,(long)iVar6);
            local_4f0 = *pvVar10;
            OpenMesh::VectorT<double,_3>::operator*
                      (&local_538,(VectorT<double,_3> *)local_440,&local_4f0);
            OpenMesh::VectorT<double,_3>::operator*(&local_520,&local_538,&distance_influence);
            OpenMesh::VectorT<double,_3>::operator*(&local_508,&local_520,&area);
            OpenMesh::VectorT<double,_3>::operator+=((VectorT<double,_3> *)&weight_sum,&local_508);
            dStack_3e0 = local_4f0 * distance_influence * area + dStack_3e0;
            local_3e4 = local_3e4 + 1;
          }
          OpenMesh::VectorT<double,_3>::operator/=
                    ((VectorT<double,_3> *)&weight_sum,&stack0xfffffffffffffc20);
          pBVar12 = &OpenMesh::Iterators::
                     GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                     ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                  *)local_370)->super_BaseHandle;
          iVar6 = OpenMesh::BaseHandle::idx(pBVar12);
          pvVar13 = std::
                    vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ::at((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                          *)local_320,(long)iVar6);
          (pvVar13->super_VectorDataT<double,_3>).values_[0] = weight_sum;
          (pvVar13->super_VectorDataT<double,_3>).values_[1] =
               temp_point.super_VectorDataT<double,_3>.values_[0];
          (pvVar13->super_VectorDataT<double,_3>).values_[2] =
               temp_point.super_VectorDataT<double,_3>.values_[1];
          std::vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_>::~vector
                    ((vector<OpenMesh::FaceHandle,_std::allocator<OpenMesh::FaceHandle>_> *)
                     local_3b8);
          GVar17 = OpenMesh::Iterators::
                   GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                   ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                 *)local_370,0);
          VVar16._8_8_ = v_it_1.mesh_;
          VVar16.mesh_ = (mesh_ptr)local_370;
          v_it_2._8_8_ = GVar17.mesh_;
        }
        VVar18 = OpenMesh::PolyConnectivity::vertices_begin((PolyConnectivity *)local_238);
        while( true ) {
          v_it_2.mesh_ = VVar18._8_8_;
          local_558 = (undefined1  [8])VVar18.mesh_;
          VVar15 = OpenMesh::PolyConnectivity::vertices_end((PolyConnectivity *)local_238);
          local_568 = VVar15;
          bVar5 = OpenMesh::Iterators::
                  GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                  ::operator!=((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                *)local_558,&local_568);
          if (!bVar5) break;
          pvVar11 = OpenMesh::Iterators::
                    GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                    ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                 *)local_558);
          _vh.super_BaseHandle.idx_ = (BaseHandle)(pvVar11->super_BaseHandle).idx_;
          pBVar12 = &OpenMesh::Iterators::
                     GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                     ::operator*((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                                  *)local_558)->super_BaseHandle;
          iVar6 = OpenMesh::BaseHandle::idx(pBVar12);
          pvVar13 = std::
                    vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ::operator[]((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                                  *)local_320,(long)iVar6);
          OpenMesh::
          AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>::
          set_point((AttribKernelT<OpenMesh::FinalMeshItemsT<MyTraits,_true>,_OpenMesh::TriConnectivity>
                     *)local_238,_vh,pvVar13);
          OpenMesh::Iterators::
          GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
          ::operator++((GenericIteratorT<OpenMesh::PolyConnectivity,_OpenMesh::VertexHandle,_OpenMesh::ArrayKernel,_&OpenMesh::ArrayKernel::has_vertex_status,_&OpenMesh::ArrayKernel::n_vertices>
                        *)local_558,0);
          VVar18._8_8_ = v_it_2.mesh_;
          VVar18.mesh_ = (mesh_ptr)local_558;
        }
        DataManager::setMesh((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
        DataManager::setDenoisedMesh
                  ((this->super_MeshDenoisingBase).data_manager_,(TriMesh *)local_238);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 *)local_320);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 *)&new_point.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        std::vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>::
        ~vector((vector<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                 *)&sigma_f);
        std::vector<double,_std::allocator<double>_>::~vector
                  ((vector<double,_std::allocator<double>_> *)
                   &face_centroid.
                    super__Vector_base<OpenMesh::VectorT<double,_3>,_std::allocator<OpenMesh::VectorT<double,_3>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage);
        sigma_g_mean_edge_length_ratio._0_4_ = 0;
        VVar15 = local_568;
        VVar4 = local_348;
      }
      else {
        sigma_g_mean_edge_length_ratio._0_4_ = 1;
      }
    }
    else {
      sigma_g_mean_edge_length_ratio._0_4_ = 1;
    }
  }
  local_568 = VVar15;
  local_348 = VVar4;
  OpenMesh::TriMesh_ArrayKernelT<MyTraits>::~TriMesh_ArrayKernelT
            ((TriMesh_ArrayKernelT<MyTraits> *)local_238);
  return;
}

Assistant:

void NonIterativeFeaturePreservingMeshFiltering::denoise()
{
    // get data
    TriMesh mesh = data_manager_->getNoisyMesh();

    if(mesh.n_vertices() == 0)
        return;

    // get parameter
    double sigma_g_mean_edge_length_ratio, sigma_f_mean_edge_length_ratio;
    if(!parameter_set_->getValue(string("sigma_f/mean_edge_length"), sigma_f_mean_edge_length_ratio))
        return;
    if(!parameter_set_->getValue(string("sigma_g/mean_edge_length"), sigma_g_mean_edge_length_ratio))
        return;

    // mesh denoise
    double mean_edge_length = getAverageEdgeLength(mesh);
    std::vector<double> face_area;
    getFaceArea(mesh, face_area);
    std::vector<TriMesh::Point> face_centroid;
    getFaceCentroid(mesh, face_centroid);

    double sigma_f = sigma_f_mean_edge_length_ratio * mean_edge_length;
    double sigma_g = sigma_g_mean_edge_length_ratio * mean_edge_length;

    std::vector<TriMesh::Normal> mollified_normals;
    mollifiedNormals(mesh, face_centroid, face_area, sigma_f, mollified_normals);

    std::vector<TriMesh::Point> new_point(mesh.n_vertices());
    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        new_point[v_it->idx()] = mesh.point(*v_it);

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
    {
        TriMesh::Point pt = mesh.point(*v_it);

        std::vector<TriMesh::FaceHandle> vertex_face_neighbor;
        getVertexFaceNeighbor(mesh, face_centroid, *v_it, sigma_f, vertex_face_neighbor);

        TriMesh::Point temp_point(0.0, 0.0, 0.0);
        double weight_sum = 0.0;

        for(int i = 0; i <(int)vertex_face_neighbor.size(); i++)
        {
            TriMesh::Point centroid = face_centroid[vertex_face_neighbor[i].idx()];
            TriMesh::Normal normal = mollified_normals[vertex_face_neighbor[i].idx()];
            TriMesh::Point projection_point = projectPoint(pt, centroid, normal);

            double distance_spatial = (centroid - pt).length();
            double weight_spatial = std::exp(- 0.5 * distance_spatial * distance_spatial /(sigma_f * sigma_f));

            double distance_influence = (projection_point - pt).length();
            double weight_influence = std::exp(- 0.5 * distance_influence * distance_influence /(sigma_g * sigma_g));

            double area = face_area[vertex_face_neighbor[i].idx()];

            temp_point += projection_point * area * weight_spatial * weight_influence;
            weight_sum += area * weight_spatial * weight_influence;
        }
        temp_point /= weight_sum;

        new_point.at((*v_it).idx()) = temp_point;
    }

    for(TriMesh::VertexIter v_it = mesh.vertices_begin(); v_it != mesh.vertices_end(); v_it++)
        mesh.set_point(*v_it, new_point[(*v_it).idx()]);

    // update data
    data_manager_->setMesh(mesh);
    data_manager_->setDenoisedMesh(mesh);
}